

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.cpp
# Opt level: O1

idx_t duckdb::StringSplitter::Split<duckdb::RegexpStringSplit>
                (string_t input,string_t delim,StringSplitInput *state,void *data)

{
  bool bVar1;
  idx_t split_size;
  idx_t list_idx;
  char *delim_data;
  char *input_data;
  idx_t input_size;
  idx_t match_size;
  idx_t local_68;
  StringSplitInput *local_60;
  void *local_58;
  undefined8 local_50;
  char *local_48;
  undefined8 local_40;
  char *local_38;
  
  local_48 = delim.value._8_8_;
  local_50 = delim.value._0_8_;
  local_38 = input.value._8_8_;
  local_40 = input.value._0_8_;
  input_size = (idx_t)input.value._0_4_;
  input_data = local_38;
  if (input_size < 0xd) {
    input_data = (char *)((long)&local_40 + 4);
  }
  delim_data = local_48;
  if ((ulong)delim.value._0_4_ < 0xd) {
    delim_data = (char *)((long)&local_50 + 4);
  }
  list_idx = 0;
  local_60 = state;
  local_58 = data;
  do {
    if (input_size == 0) {
      input_size = 0;
      break;
    }
    local_68 = 0;
    split_size = RegexpStringSplit::Find
                           (input_data,input_size,delim_data,(ulong)delim.value._0_4_,&local_68,
                            local_58);
    if ((input_size < split_size) ||
       ((local_68 == 0 && split_size == 0 && (split_size = 1, input_size == 1)))) {
      bVar1 = false;
    }
    else {
      StringSplitInput::AddSplit(local_60,input_data,split_size,list_idx);
      list_idx = list_idx + 1;
      input_data = input_data + split_size + local_68;
      input_size = input_size - (split_size + local_68);
      bVar1 = true;
    }
  } while (bVar1);
  StringSplitInput::AddSplit(local_60,input_data,input_size,list_idx);
  return list_idx + 1;
}

Assistant:

static idx_t Split(string_t input, string_t delim, StringSplitInput &state, void *data) {
		auto input_data = input.GetData();
		auto input_size = input.GetSize();
		auto delim_data = delim.GetData();
		auto delim_size = delim.GetSize();
		idx_t list_idx = 0;
		while (input_size > 0) {
			idx_t match_size = 0;
			auto pos = OP::Find(input_data, input_size, delim_data, delim_size, match_size, data);
			if (pos > input_size) {
				break;
			}
			if (match_size == 0 && pos == 0) {
				// special case: 0 length match and pos is 0
				// move to the next character
				for (pos++; pos < input_size; pos++) {
					if (IsCharacter(input_data[pos])) {
						break;
					}
				}
				if (pos == input_size) {
					break;
				}
			}
			D_ASSERT(input_size >= pos + match_size);
			state.AddSplit(input_data, pos, list_idx);

			list_idx++;
			input_data += (pos + match_size);
			input_size -= (pos + match_size);
		}
		state.AddSplit(input_data, input_size, list_idx);
		list_idx++;
		return list_idx;
	}